

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize)

{
  DynamicalSystem *pDVar1;
  _func_int **pp_Var2;
  element_type *peVar3;
  MatrixDynSize *pMVar4;
  MatrixDynSize *__r;
  uint in_ESI;
  DynamicalSystem *in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>
  *in_stack_ffffffffffffff68;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>
  *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  
  DynamicalSystem::DynamicalSystem(in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  in_RDI->_vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_003fa6d0;
  pDVar1 = in_RDI + 1;
  pp_Var2 = (_func_int **)operator_new(0xf8);
  pp_Var2[0x1c] = (_func_int *)0x0;
  pp_Var2[0x1d] = (_func_int *)0x0;
  pp_Var2[0x1a] = (_func_int *)0x0;
  pp_Var2[0x1b] = (_func_int *)0x0;
  pp_Var2[0x18] = (_func_int *)0x0;
  pp_Var2[0x19] = (_func_int *)0x0;
  pp_Var2[0x16] = (_func_int *)0x0;
  pp_Var2[0x17] = (_func_int *)0x0;
  pp_Var2[0x14] = (_func_int *)0x0;
  pp_Var2[0x15] = (_func_int *)0x0;
  pp_Var2[0x12] = (_func_int *)0x0;
  pp_Var2[0x13] = (_func_int *)0x0;
  pp_Var2[0x10] = (_func_int *)0x0;
  pp_Var2[0x11] = (_func_int *)0x0;
  pp_Var2[0xe] = (_func_int *)0x0;
  pp_Var2[0xf] = (_func_int *)0x0;
  pp_Var2[0xc] = (_func_int *)0x0;
  pp_Var2[0xd] = (_func_int *)0x0;
  pp_Var2[10] = (_func_int *)0x0;
  pp_Var2[0xb] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)0x0;
  pp_Var2[9] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)0x0;
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[0x1e] = (_func_int *)0x0;
  LinearSystemPimpl::LinearSystemPimpl((LinearSystemPimpl *)0x0);
  pDVar1->_vptr_DynamicalSystem = pp_Var2;
  *(undefined1 *)(in_RDI[1]._vptr_DynamicalSystem + 0x1e) = 0;
  *(undefined1 *)((long)in_RDI[1]._vptr_DynamicalSystem + 0xf1) = 0;
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  peVar3 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e964b);
  pMVar4 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar3);
  iDynTree::MatrixDynSize::resize((ulong)pMVar4,(ulong)in_ESI);
  peVar3 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e967c);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar3);
  iDynTree::MatrixDynSize::zero();
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>>::operator=
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  peVar3 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e96c0);
  pMVar4 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar3);
  iDynTree::MatrixDynSize::resize((ulong)pMVar4,(ulong)in_ESI);
  peVar3 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e96f7);
  __r = TimeInvariantObject<iDynTree::MatrixDynSize>::get(peVar3);
  iDynTree::MatrixDynSize::zero();
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             pMVar4,(shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>
                     *)__r);
  std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *
              )0x2e9731);
  std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *
              )0x2e973b);
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize,
                                   size_t controlSize)
        : DynamicalSystem(stateSize, controlSize)
        , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;
        }